

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>::
Read(NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
     *this,TextReader<fmt::Locale> *bound_reader)

{
  VarBoundHandler<TestNLHandler2> *pVVar1;
  StringRef name_00;
  bool bVar2;
  int iVar3;
  long in_RSI;
  NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
  *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  TextReader<fmt::Locale> *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  TextReader<fmt::Locale> *in_stack_fffffffffffffef0;
  uint in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff00;
  TextReader<fmt::Locale> *in_stack_ffffffffffffff08;
  CStringRef in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  VarBoundHandler<TestNLHandler2> *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  BasicCStringRef<char> local_a8;
  BasicCStringRef<char> local_a0;
  BasicCStringRef<char> local_98;
  BasicCStringRef<char> local_90;
  uint local_84;
  char *local_80;
  size_t local_78;
  StringRef local_70;
  int local_5c;
  BasicCStringRef<char> local_58;
  int local_4c;
  int local_48;
  int local_3c;
  int local_38;
  int local_34;
  int local_2c;
  int local_28;
  int local_20;
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  in_RDI->num_vars_and_exprs_ =
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_both +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_cons +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_objs +
       (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_common_exprs_in_single_cons
       + (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.
         num_common_exprs_in_single_objs;
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar(&in_RDI->reader_->super_ReaderBase);
    switch(local_12) {
    case '\0':
      bVar2 = ReaderBase::IsEOF((ReaderBase *)0x1faa6b);
      if (bVar2) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_a0,"segment \'b\' missing");
          TextReader<fmt::Locale>::ReportError<>
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
        }
        return;
      }
    default:
      in_stack_fffffffffffffee0 = in_RDI->reader_;
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_a8,"invalid segment type");
      TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      break;
    case 'C':
      local_18 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff00);
      in_stack_ffffffffffffff38 = in_RDI->handler_;
      in_stack_ffffffffffffff44 = local_18;
      ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                       *)in_stack_fffffffffffffee0,SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0))
      ;
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::
      OnAlgebraicCon((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                      *)in_stack_ffffffffffffff38,in_stack_ffffffffffffff44);
      break;
    case 'F':
      local_48 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_4c = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1fa798);
      if ((local_4c != 0) && (local_4c != 1)) {
        in_stack_ffffffffffffff08 = in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_58,"invalid function type");
        TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      }
      local_5c = TextReader<fmt::Locale>::ReadInt<int>(in_stack_fffffffffffffef0);
      local_70 = TextReader<fmt::Locale>::ReadName(in_stack_fffffffffffffef0);
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff00);
      local_80 = local_70.data_;
      local_78 = local_70.size_;
      name_00.data_._4_4_ = in_stack_fffffffffffffefc;
      name_00.data_._0_4_ = in_stack_fffffffffffffef8;
      name_00.size_ = (size_t)in_stack_ffffffffffffff00;
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::OnFunction
                ((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr> *
                 )in_stack_fffffffffffffef0,(int)((ulong)in_stack_fffffffffffffee8 >> 0x20),name_00,
                 (int)in_stack_fffffffffffffee8,(Type)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      break;
    case 'G':
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::ObjHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff00);
      break;
    case 'J':
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff00);
      break;
    case 'K':
      ReadColumnSizes<false>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff00);
      break;
    case 'L':
      local_20 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff00);
      pVVar1 = in_RDI->handler_;
      in_stack_ffffffffffffff34 = local_20;
      ReadLogicalExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                       *)in_stack_ffffffffffffff00);
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::OnLogicalCon
                ((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr> *
                 )pVVar1,in_stack_ffffffffffffff34);
      break;
    case 'O':
      local_28 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_2c = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1fa612);
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff00);
      ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                       *)in_stack_fffffffffffffee0,SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0))
      ;
      bVar2 = NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::
              NeedObj((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                       *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      if (bVar2) {
        pVVar1 = in_RDI->handler_;
        iVar3 = NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::
                resulting_obj_index((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                                     *)in_RDI->handler_,local_28);
        NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::OnObj
                  ((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                    *)pVVar1,iVar3,local_2c != 0);
      }
      break;
    case 'S':
      local_84 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1fa8ae);
      if (7 < (int)local_84) {
        in_stack_ffffffffffffff00 = in_RDI->reader_;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"invalid suffix kind");
        TextReader<fmt::Locale>::ReportError<>(in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
      }
      in_stack_fffffffffffffef8 = local_84 & 3;
      in_stack_fffffffffffffefc = 0;
      iVar3 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      switch(in_stack_fffffffffffffef8) {
      case 0:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
        break;
      case 1:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::ConHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
        break;
      case 2:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::ObjHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
        break;
      case 3:
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::ProblemHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                    *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),iVar3);
      }
      break;
    case 'V':
      local_34 = ReadUInt((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                           *)in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
                          in_stack_fffffffffffffef8);
      local_34 = local_34 - (in_RDI->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
      local_38 = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1fa6d4);
      local_3c = TextReader<fmt::Locale>::ReadUInt((TextReader<fmt::Locale> *)0x1fa6ea);
      TextReader<fmt::Locale>::ReadTillEndOfLine(in_stack_ffffffffffffff00);
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::
      BeginCommonExpr((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                       *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                      in_stack_fffffffffffffed8);
      if (local_38 != 0) {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,TestNLHandler2::TestExpr>::LinearExprHandler>
                  (in_RDI,local_38);
      }
      iVar3 = local_34;
      in_stack_ffffffffffffff10.data_ = (char *)in_RDI->handler_;
      ReadNumericExpr((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                       *)in_stack_fffffffffffffee0,SUB41((uint)in_stack_fffffffffffffedc >> 0x18,0))
      ;
      NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>::
      EndCommonExpr((NLHandler<mp::NullNLHandler<TestNLHandler2::TestExpr>,_TestNLHandler2::TestExpr>
                     *)in_stack_ffffffffffffff10.data_,iVar3,local_3c);
      break;
    case 'b':
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_fffffffffffffef0 = in_RDI->reader_;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_98,"duplicate \'b\' segment");
          TextReader<fmt::Locale>::ReportError<>
                    (in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
        }
        TextReader<fmt::Locale>::operator=
                  (in_stack_fffffffffffffee0,
                   (TextReader<fmt::Locale> *)
                   CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                  ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                    *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
        ReaderBase::ptr(&in_RDI->reader_->super_ReaderBase);
        if ((in_RDI->flags_ & 1U) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case 'd':
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff10.data_);
      break;
    case 'k':
      ReadColumnSizes<true>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff10.data_);
      break;
    case 'r':
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::AlgebraicConHandler>
                (in_RDI);
      break;
    case 'x':
      NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,mp::internal::VarBoundHandler<TestNLHandler2>>::VarHandler>
                ((NLReader<mp::internal::TextReader<fmt::Locale>,_mp::internal::VarBoundHandler<TestNLHandler2>_>
                  *)in_stack_ffffffffffffff10.data_);
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}